

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::str_replace_all
                   (string *__return_storage_ptr__,string *s,char *target,char *replacement)

{
  size_t __n;
  size_t __n_00;
  size_type sVar1;
  char *pcVar2;
  size_t find_offset;
  size_t read_offset;
  size_t replacement_size;
  size_t target_size;
  char *replacement_local;
  char *target_local;
  string *s_local;
  string *ret;
  
  __n = strlen(target);
  __n_00 = strlen(replacement);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  find_offset = 0;
  while (sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(s), find_offset < sVar1) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (s,target,find_offset,__n);
    if (sVar1 == 0xffffffffffffffff) {
      pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               data(s);
      sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(s);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,pcVar2 + find_offset,sVar1 - find_offset);
      find_offset = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(s);
    }
    else {
      pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               data(s);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,pcVar2 + find_offset,sVar1 - find_offset);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,replacement,__n_00);
      find_offset = sVar1 + __n;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string str_replace_all(const string& s, const char* target, const char* replacement) {
  size_t target_size = strlen(target);
  size_t replacement_size = strlen(replacement);

  string ret;
  for (size_t read_offset = 0; read_offset < s.size();) {
    size_t find_offset = s.find(target, read_offset, target_size);
    if (find_offset == string::npos) {
      ret.append(s.data() + read_offset, s.size() - read_offset);
      read_offset = s.size();
    } else {
      ret.append(s.data() + read_offset, find_offset - read_offset);
      ret.append(replacement, replacement_size);
      read_offset = find_offset + target_size;
    }
  }
  return ret;
}